

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void google::protobuf::MessageFactory::InternalRegisterGeneratedFile(DescriptorTable *table)

{
  GeneratedMessageFactory *pGVar1;
  LogMessage *pLVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_char_*const,_const_google::protobuf::internal::DescriptorTable_*>,_false,_true>,_bool>
  pVar3;
  __node_gen_type __node_gen;
  unordered_map<const_char_*,_const_google::protobuf::internal::DescriptorTable_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::internal::DescriptorTable_*>_>_>
  *local_50;
  char *local_48;
  DescriptorTable *local_40;
  
  pGVar1 = anon_unknown_0::GeneratedMessageFactory::singleton();
  local_50 = &pGVar1->file_map_;
  local_48 = table->filename;
  local_40 = table;
  pVar3 = std::
          _Hashtable<char_const*,std::pair<char_const*const,google::protobuf::internal::DescriptorTable_const*>,std::allocator<std::pair<char_const*const,google::protobuf::internal::DescriptorTable_const*>>,std::__detail::_Select1st,google::protobuf::streq,google::protobuf::hash<char_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_insert<std::pair<char_const*const,google::protobuf::internal::DescriptorTable_const*>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<char_const*const,google::protobuf::internal::DescriptorTable_const*>,true>>>>
                    ();
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x247);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_48,"File is already registered: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,table->filename);
    internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)&local_48);
  }
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedFile(
    const google::protobuf::internal::DescriptorTable* table) {
  GeneratedMessageFactory::singleton()->RegisterFile(table);
}